

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPSDESPacket::GetPRIVPrefixLength(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (((((this->super_RTCPPacket).knownformat == true) &&
       (puVar1 = this->currentchunk, puVar1 != (uint8_t *)0x0)) &&
      (sVar2 = this->itemoffset, puVar1[sVar2] == '\b')) && (puVar1[sVar2 + 1] != 0)) {
    sVar3 = 0;
    if ((uint)puVar1[sVar2 + 2] <= puVar1[sVar2 + 1] - 1) {
      sVar3 = (ulong)puVar1[sVar2 + 2];
    }
    return sVar3;
  }
  return 0;
}

Assistant:

inline size_t RTCPSDESPacket::GetPRIVPrefixLength() const
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	return prefixlength;
}